

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r7pf.cpp
# Opt level: O3

int R7PfIter(MatrixXd *Xin,MatrixXd *uin,Vector3d *vk,double r0,RSDoublelinCameraPoseVector *results
            )

{
  ulong *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  variable_if_dynamic<long,__1> vVar5;
  PointerType pdVar6;
  Vector3d *pVVar7;
  Index size_4;
  double *pdVar8;
  undefined8 *puVar9;
  variable_if_dynamic<long,__1> vVar10;
  double *pdVar11;
  variable_if_dynamic<long,__1> *pvVar12;
  long lVar13;
  PointerType pdVar14;
  Index index;
  double dVar15;
  Index size_3;
  long lVar16;
  double dVar17;
  Index othersize;
  long lVar18;
  undefined8 in_XMM0_Qb;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  MatrixXd u;
  VectorXcd ff;
  MatrixXd X;
  MatrixXd A;
  MatrixXd n;
  MatrixXd A1;
  VectorXd x;
  MatrixXd A0;
  GeneralizedEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> ges;
  MatrixXcd xx;
  MatrixXd nn;
  complex<double> *local_4e0;
  PointerType pdStack_4d8;
  DenseStorage<double,__1,__1,__1,_0> local_4c8;
  PointerType local_4a8;
  undefined8 uStack_4a0;
  PointerType local_490;
  PointerType local_488;
  Matrix<double,__1,__1,_0,__1,__1> local_478;
  assign_op<double,_double> local_459;
  DenseStorage<double,__1,__1,__1,_0> local_458;
  DstEvaluatorType *local_440;
  double local_438;
  assign_op<double,_double> *local_430;
  RSDoublelinCameraPose local_428;
  DenseStorage<double,__1,__1,__1,_0> local_3b8;
  Matrix<double,__1,__1,_0,__1,__1> local_398;
  undefined1 local_380 [8];
  variable_if_dynamic<long,__1> local_378;
  PointerType local_370;
  variable_if_dynamic<long,__1> local_368;
  PointerType local_360;
  double *pdStack_358;
  PointerType local_350;
  PointerType local_348;
  PointerType local_340;
  variable_if_dynamic<long,__1> local_338;
  PointerType local_330;
  scalar_constant_op<double> local_328;
  complex<double> *local_318;
  PointerType local_310;
  variable_if_dynamic<long,__1> local_308;
  complex<double> *local_300;
  PointerType local_2f8;
  PointerType local_2f0;
  complex<double> *local_2e8;
  variable_if_dynamic<long,__1> local_2e0;
  scalar_constant_op<double> local_2d8;
  PointerType local_2d0;
  double local_2c8;
  scalar_constant_op<double> local_2c0;
  PointerType local_2b8;
  complex<double> *local_2b0;
  complex<double> *local_2a8;
  variable_if_dynamic<long,__1> local_2a0;
  PointerType local_298;
  complex<double> *local_290;
  PointerType local_288;
  PointerType local_280;
  variable_if_dynamic<long,__1> local_278;
  scalar_constant_op<double> local_270;
  PointerType local_268;
  PointerType local_260;
  scalar_constant_op<double> local_258;
  complex<double> *local_250;
  complex<double> *local_248;
  PointerType local_240;
  variable_if_dynamic<long,__1> local_238;
  PointerType local_230;
  PointerType local_228;
  PointerType local_220;
  PointerType local_218;
  complex<double> *local_208;
  PointerType local_1f8;
  double local_1f0;
  PointerType local_1e8;
  PointerType local_1d8;
  PointerType local_1d0;
  complex<double> *local_1c8;
  complex<double> *local_1c0;
  complex<double> *local_1b8;
  PointerType local_1b0;
  PointerType local_1a8;
  PointerType local_1a0;
  PointerType local_190;
  complex<double> *local_180;
  double local_178;
  PointerType local_170;
  PointerType local_160;
  PointerType local_158;
  complex<double> *local_150;
  complex<double> *local_148;
  PointerType local_140;
  PointerType local_138;
  double local_130;
  PointerType local_128;
  PointerType local_120;
  PointerType local_118;
  complex<double> *local_110;
  complex<double> *local_108;
  complex<double> *local_100;
  PointerType local_f8;
  PointerType local_f0;
  complex<double> *local_e8;
  PointerType local_d8;
  PointerType local_d0;
  complex<double> *local_c8;
  complex<double> *local_c0;
  PointerType local_b8;
  PointerType local_b0;
  undefined8 local_a8;
  PointerType local_98;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_90;
  DenseStorage<double,__1,__1,__1,_0> local_58;
  Vector3d *local_40;
  RSDoublelinCameraPoseVector *local_38;
  
  local_4a8 = (PointerType)r0;
  uStack_4a0 = in_XMM0_Qb;
  local_380 = (undefined1  [8])Xin;
  local_38 = results;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_490,
             (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             local_380);
  local_380 = (undefined1  [8])uin;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_4e0,
             (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             local_380);
  local_380 = (undefined1  [8])0x7;
  local_378.m_value = 0xb;
  local_370 = (PointerType)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_478,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_380);
  dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data & 7) == 0) &&
     (dVar15 = (double)(ulong)((uint)((ulong)local_478.
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                             .m_storage.m_data >> 3) & 1),
     local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar15)) {
    dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  lVar16 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar15;
  if (0 < (long)dVar15) {
    dVar17 = 0.0;
    do {
      local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [(long)dVar17] =
           -local_490[(long)local_488 * 2 + (long)dVar17] *
           *(double *)((long)local_4e0->_M_value + dVar17 * 8);
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar15 != dVar17);
  }
  dVar17 = (double)((lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar15);
  if (1 < lVar16) {
    do {
      dVar21 = (local_490 + (long)local_488 * 2 + (long)dVar15)[1];
      dVar2 = ((double *)((long)local_4e0->_M_value + dVar15 * 8))[1];
      local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [(long)dVar15] =
           *(double *)((long)local_4e0->_M_value + dVar15 * 8) *
           -local_490[(long)local_488 * 2 + (long)dVar15];
      (local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
      (long)dVar15)[1] = dVar2 * -dVar21;
      dVar15 = (double)((long)dVar15 + 2);
    } while ((long)dVar15 < (long)dVar17);
  }
  if ((long)dVar17 <
      local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
    do {
      local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [(long)dVar17] =
           -local_490[(long)local_488 * 2 + (long)dVar17] *
           *(double *)((long)local_4e0->_M_value + dVar17 * 8);
      dVar17 = (double)((long)dVar17 + 1);
    } while ((double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows != dVar17);
  }
  pdVar8 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
  dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)pdVar8 & 7) == 0) &&
     (dVar15 = (double)(ulong)((uint)((ulong)pdVar8 >> 3) & 1),
     local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar15)) {
    dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  lVar16 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar15;
  if (0 < (long)dVar15) {
    dVar17 = 0.0;
    do {
      pdVar8[(long)dVar17] =
           -local_490[(long)local_488 * 2 + (long)dVar17] *
           *(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8);
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar15 != dVar17);
  }
  dVar17 = (double)((lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar15);
  if (1 < lVar16) {
    do {
      dVar21 = (local_490 + (long)local_488 * 2 + (long)dVar15)[1];
      dVar2 = ((double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar15) * 8))[1];
      pdVar8[(long)dVar15] =
           *(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar15) * 8) *
           -local_490[(long)local_488 * 2 + (long)dVar15];
      (pdVar8 + (long)dVar15)[1] = dVar2 * -dVar21;
      dVar15 = (double)((long)dVar15 + 2);
    } while ((long)dVar15 < (long)dVar17);
  }
  if ((long)dVar17 <
      local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
    do {
      pdVar8[(long)dVar17] =
           -local_490[(long)local_488 * 2 + (long)dVar17] *
           *(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8);
      dVar17 = (double)((long)dVar17 + 1);
    } while ((double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows != dVar17);
  }
  local_98 = (PointerType)
             (local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows * 0x10);
  pdVar8 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * 2;
  dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)pdVar8 & 7) == 0) &&
     (dVar15 = (double)(ulong)((uint)((ulong)pdVar8 >> 3) & 1),
     local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar15)) {
    dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  lVar16 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar15;
  if (0 < (long)dVar15) {
    dVar17 = 0.0;
    do {
      pdVar8[(long)dVar17] =
           local_490[(long)local_488 + (long)dVar17] *
           *(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8) +
           local_490[(long)dVar17] * *(double *)((long)local_4e0->_M_value + dVar17 * 8);
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar15 != dVar17);
  }
  lVar13 = (long)dVar15 + (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU);
  dVar17 = dVar15;
  if (1 < lVar16) {
    do {
      dVar21 = (local_490 + (long)dVar17)[1];
      dVar2 = ((double *)((long)local_4e0->_M_value + dVar17 * 8))[1];
      dVar3 = (local_490 + (long)local_488 + (long)dVar17)[1];
      dVar4 = ((double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8))[1];
      pdVar8[(long)dVar17] =
           *(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8) *
           local_490[(long)local_488 + (long)dVar17] +
           *(double *)((long)local_4e0->_M_value + dVar17 * 8) * local_490[(long)dVar17];
      (pdVar8 + (long)dVar17)[1] = dVar4 * dVar3 + dVar2 * dVar21;
      dVar17 = (double)((long)dVar17 + 2);
    } while ((long)dVar17 < lVar13);
  }
  if (lVar13 < local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows) {
    lVar18 = lVar16 / 2;
    lVar13 = 0;
    do {
      local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [(long)dVar15 +
       lVar18 * 2 +
       local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       2 + lVar13] = local_490[(long)local_488 + (long)dVar15 + lVar18 * 2 + lVar13] *
                     *(double *)
                      ((long)local_4e0[lVar18]._M_value +
                      ((long)pdStack_4d8 + (long)dVar15 + lVar13) * 8) +
                     local_490[(long)dVar15 + lVar18 * 2 + lVar13] *
                     *(double *)((long)local_4e0[lVar18]._M_value + ((long)dVar15 + lVar13) * 8);
      lVar13 = lVar13 + 1;
    } while (lVar16 % 2 != lVar13);
  }
  local_348 = local_490 + (long)local_488 * 2;
  local_270.m_other =
       (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0];
  local_2d8.m_other =
       (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1];
  local_288 = local_490 + (long)local_488;
  local_4c8.m_data =
       local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       3;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 1.48219693752374e-323;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_378.m_value = (long)local_4e0;
  local_368.m_value = (long)pdStack_4d8;
  local_338.m_value = (long)local_488;
  local_328.m_other = (double)local_4a8;
  local_318 = local_4e0;
  local_308.m_value = (long)pdStack_4d8;
  local_2f0 = local_490;
  local_2e0.m_value = (long)local_488;
  local_2c0.m_other = (double)local_4a8;
  local_2b0 = local_4e0;
  local_2a0.m_value = (long)pdStack_4d8;
  local_278.m_value = (long)local_488;
  local_258.m_other = (double)local_4a8;
  local_248 = local_4e0;
  local_238.m_value = (long)pdStack_4d8;
  local_4c8.m_cols =
       local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_4c8.m_data;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_478;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_4c8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)local_380;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)&local_58;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)&local_428;
  local_40 = vk;
  Eigen::internal::dense_assignment_loop<$59378380$>::run
            ((generic_dense_assignment_kernel<_444fe5b5_> *)&local_90);
  local_378.m_value = (long)local_4e0->_M_value + pdStack_4d8 * 8;
  local_348 = local_490 + (long)local_488 * 2;
  local_270.m_other =
       (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0];
  local_2d8.m_other =
       (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1];
  local_288 = local_490 + (long)local_488;
  local_4c8.m_data =
       local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       4;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 1.97626258336499e-323;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_368.m_value = (long)pdStack_4d8;
  local_338.m_value = (long)local_488;
  local_328.m_other = (double)local_4a8;
  local_318 = local_4e0;
  local_308.m_value = (long)pdStack_4d8;
  local_2f0 = local_490;
  local_2e0.m_value = (long)local_488;
  local_2c0.m_other = (double)local_4a8;
  local_2b0 = local_4e0;
  local_2a0.m_value = (long)pdStack_4d8;
  local_278.m_value = (long)local_488;
  local_258.m_other = (double)local_4a8;
  local_248 = local_4e0;
  local_238.m_value = (long)pdStack_4d8;
  local_4c8.m_cols =
       local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_4c8.m_data;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_478;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_4c8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)local_380;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)&local_58;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)&local_428;
  Eigen::internal::dense_assignment_loop<$59378380$>::run
            ((generic_dense_assignment_kernel<_444fe5b5_> *)&local_90);
  local_2e0.m_value = (long)(local_490 + (long)local_488);
  local_2c8 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2];
  local_278.m_value = (long)(local_490 + (long)local_488 * 2);
  local_110 = (complex<double> *)
              (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  local_260 = (PointerType)
              (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[1];
  local_4c8.m_data =
       local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       5;
  local_218 = (PointerType)((long)local_4e0->_M_value + pdStack_4d8 * 8);
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 2.47032822920623e-323;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_368.m_value = (long)local_4e0;
  pdStack_358 = pdStack_4d8;
  local_338.m_value = (long)local_490;
  local_328.m_other = (double)local_488;
  local_318 = (complex<double> *)local_4a8;
  local_308.m_value = (long)local_4e0;
  local_2f8 = pdStack_4d8;
  local_2d0 = local_488;
  local_2b0 = (complex<double> *)local_4a8;
  local_2a0.m_value = (long)local_4e0;
  local_290 = (complex<double> *)pdStack_4d8;
  local_268 = local_488;
  local_248 = (complex<double> *)local_4a8;
  local_238.m_value = (long)local_4e0;
  local_228 = pdStack_4d8;
  local_208 = (complex<double> *)pdStack_4d8;
  local_1d8 = local_488;
  local_1c8 = (complex<double> *)local_4a8;
  local_1b8 = local_4e0;
  local_1a8 = pdStack_4d8;
  local_190 = local_490;
  local_180 = (complex<double> *)local_488;
  local_160 = local_4a8;
  local_150 = local_4e0;
  local_140 = pdStack_4d8;
  local_118 = local_488;
  local_f8 = local_4a8;
  local_e8 = local_4e0;
  local_d8 = pdStack_4d8;
  local_4c8.m_cols =
       local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_4c8.m_data;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_478;
  local_1e8 = (PointerType)local_2e0.m_value;
  local_178 = local_2c8;
  local_128 = (PointerType)local_278.m_value;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_4c8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)local_380;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)&local_58;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)&local_428;
  Eigen::internal::dense_assignment_loop<$a449f637$>::run
            ((generic_dense_assignment_kernel<_77ea032a_> *)&local_90);
  pdVar8 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * 6;
  dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)pdVar8 & 7) == 0) &&
     (dVar15 = (double)(ulong)((uint)((ulong)pdVar8 >> 3) & 1),
     local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar15)) {
    dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  lVar16 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar15;
  if (0 < (long)dVar15) {
    dVar17 = 0.0;
    do {
      pdVar8[(long)dVar17] =
           -*(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8);
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar15 != dVar17);
  }
  dVar17 = (double)((lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar15);
  if (1 < lVar16) {
    do {
      dVar21 = ((double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar15) * 8))[1];
      pdVar8[(long)dVar15] =
           -*(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar15) * 8);
      (pdVar8 + (long)dVar15)[1] = -dVar21;
      dVar15 = (double)((long)dVar15 + 2);
    } while ((long)dVar15 < (long)dVar17);
  }
  if ((long)dVar17 <
      local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
    do {
      pdVar8[(long)dVar17] =
           -*(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8);
      dVar17 = (double)((long)dVar17 + 1);
    } while ((double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows != dVar17);
  }
  local_380 = (undefined1  [8])local_4e0;
  local_378.m_value = (long)pdStack_4d8;
  local_368.m_value = (long)&local_4e0;
  local_360 = (PointerType)0x0;
  pdStack_358 = (double *)0x0;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)(local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 7);
  local_350 = pdStack_4d8;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 3.45845952088873e-323;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_478;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::operator=
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
             &local_428,
             (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
             local_380);
  pdVar8 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * 8;
  dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)pdVar8 & 7) == 0) &&
     (dVar15 = (double)(ulong)((uint)((ulong)pdVar8 >> 3) & 1),
     local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar15)) {
    dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  lVar16 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar15;
  if (0 < (long)dVar15) {
    dVar17 = 0.0;
    do {
      pdVar8[(long)dVar17] =
           ((double)local_4a8 - *(double *)((long)local_4e0->_M_value + dVar17 * 8)) *
           *(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8);
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar15 != dVar17);
  }
  lVar13 = (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar15;
  dVar17 = dVar15;
  if (1 < lVar16) {
    do {
      dVar21 = ((double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8))[1];
      dVar2 = ((double *)((long)local_4e0->_M_value + dVar17 * 8))[1];
      pdVar8[(long)dVar17] =
           ((double)local_4a8 - *(double *)((long)local_4e0->_M_value + dVar17 * 8)) *
           *(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8);
      (pdVar8 + (long)dVar17)[1] = ((double)local_4a8 - dVar2) * dVar21;
      dVar17 = (double)((long)dVar17 + 2);
    } while ((long)dVar17 < lVar13);
  }
  if (lVar13 < local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows) {
    lVar13 = lVar16 % 2;
    pdVar8 = (double *)((long)local_4e0[lVar16 / 2]._M_value + dVar15 * 8);
    pdVar11 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data + (long)dVar15 +
                       (lVar16 / 2) * 2 +
                       local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows * 8;
    do {
      *pdVar11 = ((double)local_4a8 - *pdVar8) * pdVar8[(long)pdStack_4d8];
      pdVar8 = pdVar8 + 1;
      pdVar11 = pdVar11 + 1;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  pdVar8 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * 9;
  dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)pdVar8 & 7) == 0) &&
     (dVar15 = (double)(ulong)((uint)((ulong)pdVar8 >> 3) & 1),
     local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar15)) {
    dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  lVar16 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar15;
  if (0 < (long)dVar15) {
    dVar17 = 0.0;
    do {
      pdVar8[(long)dVar17] =
           -*(double *)((long)local_4e0->_M_value + dVar17 * 8) *
           ((double)local_4a8 - *(double *)((long)local_4e0->_M_value + dVar17 * 8));
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar15 != dVar17);
  }
  dVar17 = (double)((lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar15);
  if (1 < lVar16) {
    do {
      dVar21 = *(double *)((long)local_4e0->_M_value + dVar15 * 8);
      dVar2 = ((double *)((long)local_4e0->_M_value + dVar15 * 8))[1];
      pdVar8[(long)dVar15] = -dVar21 * ((double)local_4a8 - dVar21);
      (pdVar8 + (long)dVar15)[1] = -dVar2 * ((double)local_4a8 - dVar2);
      dVar15 = (double)((long)dVar15 + 2);
    } while ((long)dVar15 < (long)dVar17);
  }
  if ((long)dVar17 <
      local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
    do {
      pdVar8[(long)dVar17] =
           -*(double *)((long)local_4e0->_M_value + dVar17 * 8) *
           ((double)local_4a8 - *(double *)((long)local_4e0->_M_value + dVar17 * 8));
      dVar17 = (double)((long)dVar17 + 1);
    } while ((double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows != dVar17);
  }
  pdVar8 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data + local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * 10;
  dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  if ((((ulong)pdVar8 & 7) == 0) &&
     (dVar15 = (double)(ulong)((uint)((ulong)pdVar8 >> 3) & 1),
     local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows <=
     (long)dVar15)) {
    dVar15 = (double)local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
  }
  local_98 = local_488;
  lVar16 = local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows - (long)dVar15;
  if (0 < (long)dVar15) {
    dVar17 = 0.0;
    do {
      pdVar8[(long)dVar17] =
           local_490[(long)local_488 + (long)dVar17] *
           *(double *)((long)local_4e0->_M_value + dVar17 * 8) -
           local_490[(long)dVar17] *
           *(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8);
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar15 != dVar17);
  }
  lVar13 = (long)dVar15 + (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU);
  dVar17 = dVar15;
  if (1 < lVar16) {
    do {
      dVar21 = (local_490 + (long)local_488 + (long)dVar17)[1];
      dVar2 = ((double *)((long)local_4e0->_M_value + dVar17 * 8))[1];
      dVar3 = (local_490 + (long)dVar17)[1];
      dVar4 = ((double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8))[1];
      pdVar8[(long)dVar17] =
           *(double *)((long)local_4e0->_M_value + dVar17 * 8) *
           local_490[(long)local_488 + (long)dVar17] -
           *(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8) *
           local_490[(long)dVar17];
      (pdVar8 + (long)dVar17)[1] = dVar2 * dVar21 - dVar4 * dVar3;
      dVar17 = (double)((long)dVar17 + 2);
    } while ((long)dVar17 < lVar13);
  }
  if (lVar13 < local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows) {
    lVar18 = lVar16 / 2;
    lVar13 = 0;
    do {
      local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [(long)dVar15 +
       lVar18 * 2 +
       local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       10 + lVar13] =
           local_490[(long)local_488 + (long)dVar15 + lVar18 * 2 + lVar13] *
           *(double *)((long)local_4e0[lVar18]._M_value + ((long)dVar15 + lVar13) * 8) -
           local_490[(long)dVar15 + lVar18 * 2 + lVar13] *
           *(double *)
            ((long)local_4e0[lVar18]._M_value + ((long)pdStack_4d8 + (long)dVar15 + lVar13) * 8);
      lVar13 = lVar13 + 1;
    } while (lVar16 % 2 != lVar13);
  }
  Eigen::FullPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  FullPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((FullPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_380,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_478);
  pVVar7 = local_40;
  Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::kernel_retval_base
            ((kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_428,(DecompositionType *)local_380);
  local_58.m_data = (double *)0x0;
  local_58.m_rows = 0;
  local_58.m_cols = 0;
  dVar15 = *(double *)
            ((long)local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0] + 0x10);
  if ((local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
       array[2] != 0.0 && dVar15 != 0.0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
             SEXT816((long)local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2]),0) < (long)dVar15)) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = std::ios::widen;
    __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_58,
             (long)local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2] * (long)dVar15,(Index)dVar15,
             (Index)local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2]);
  Eigen::internal::kernel_retval<Eigen::FullPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
  evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((kernel_retval<Eigen::FullPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)&local_428,
             (Matrix<double,__1,__1,_0,__1,__1> *)&local_58);
  free((void *)local_338.m_value);
  free(local_348);
  free(pdStack_358);
  free((void *)local_368.m_value);
  free((void *)local_380);
  local_458.m_data = (double *)0x0;
  local_458.m_rows = 0;
  local_458.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_458,0x28,10,4);
  lVar16 = 0;
  do {
    *(double *)((long)local_458.m_data + lVar16) =
         *(double *)((long)local_58.m_data + lVar16) -
         (*(double *)((long)local_58.m_data + lVar16 + local_58.m_rows * 0x18) * local_58.m_data[10]
         ) / local_58.m_data[local_58.m_rows * 3 + 10];
    *(double *)((long)local_458.m_data + lVar16 + local_458.m_rows * 8) =
         *(double *)((long)local_58.m_data + lVar16 + local_58.m_rows * 8) -
         (*(double *)((long)local_58.m_data + lVar16 + local_58.m_rows * 0x18) *
         local_58.m_data[local_58.m_rows + 10]) / local_58.m_data[local_58.m_rows * 3 + 10];
    *(double *)((long)local_458.m_data + lVar16 + local_458.m_rows * 0x10) =
         *(double *)((long)local_58.m_data + lVar16 + local_58.m_rows * 0x10) -
         (*(double *)((long)local_58.m_data + lVar16 + local_58.m_rows * 0x18) *
         local_58.m_data[local_58.m_rows * 2 + 10]) / local_58.m_data[local_58.m_rows * 3 + 10];
    *(double *)((long)local_458.m_data + lVar16 + local_458.m_rows * 0x18) =
         *(double *)((long)local_58.m_data + lVar16 + local_58.m_rows * 0x18) /
         local_58.m_data[local_58.m_rows * 3 + 10];
    lVar16 = lVar16 + 8;
  } while (lVar16 != 0x50);
  local_380 = (undefined1  [8])0x7;
  local_378.m_value = 6;
  local_370 = (PointerType)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_398,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_380);
  local_328.m_other = local_458.m_data[5];
  local_208 = (complex<double> *)*local_458.m_data;
  local_2e8 = (complex<double> *)local_458.m_data[2];
  local_1f0 = local_458.m_data[3];
  dVar15 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_2d0 = (PointerType)(local_1f0 * dVar15);
  local_290 = (complex<double> *)local_458.m_data[7];
  local_278.m_value = (long)local_458.m_data[9];
  local_230 = local_490 + (long)local_488 * 2;
  local_1a8 = (PointerType)(dVar15 * local_328.m_other);
  local_160 = local_490 + (long)local_488;
  local_138 = (PointerType)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] * local_1f0);
  local_f0 = (PointerType)
             ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2] * local_328.m_other);
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  pdStack_358 = local_490;
  local_348 = local_488;
  local_310 = local_4a8;
  local_300 = local_4e0;
  local_2f0 = pdStack_4d8;
  local_2b8 = local_4a8;
  local_2a8 = local_4e0;
  local_298 = pdStack_4d8;
  local_260 = local_4a8;
  local_250 = local_4e0;
  local_240 = pdStack_4d8;
  local_220 = local_488;
  local_1d8 = local_4a8;
  local_1c8 = local_4e0;
  local_1b8 = (complex<double> *)pdStack_4d8;
  local_190 = local_4a8;
  local_180 = local_4e0;
  local_170 = pdStack_4d8;
  local_150 = (complex<double> *)local_488;
  local_120 = local_4a8;
  local_110 = local_4e0;
  local_100 = (complex<double> *)pdStack_4d8;
  local_d8 = local_4a8;
  local_c8 = local_4e0;
  local_b8 = pdStack_4d8;
  local_4c8.m_data =
       local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  local_4c8.m_cols =
       local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_398;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_4c8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)local_380;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)&local_440;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)&local_428;
  Eigen::internal::dense_assignment_loop<$520e73b0$>::run
            ((generic_dense_assignment_kernel<_66f29dd1_> *)&local_90);
  local_328.m_other = local_458.m_data[local_458.m_rows + 5];
  local_208 = (complex<double> *)local_458.m_data[local_458.m_rows];
  local_2e8 = (complex<double> *)local_458.m_data[local_458.m_rows + 2];
  local_1f0 = local_458.m_data[local_458.m_rows + 3];
  dVar15 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_2d0 = (PointerType)(local_1f0 * dVar15);
  local_290 = (complex<double> *)local_458.m_data[local_458.m_rows + 7];
  local_278.m_value = (long)local_458.m_data[local_458.m_rows + 9];
  local_230 = local_490 + (long)local_488 * 2;
  local_1a8 = (PointerType)(dVar15 * local_328.m_other);
  local_160 = local_490 + (long)local_488;
  local_138 = (PointerType)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] * local_1f0);
  local_4c8.m_data =
       local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_f0 = (PointerType)
             ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2] * local_328.m_other);
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 4.94065645841247e-324;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  pdStack_358 = local_490;
  local_348 = local_488;
  local_310 = local_4a8;
  local_300 = local_4e0;
  local_2f0 = pdStack_4d8;
  local_2b8 = local_4a8;
  local_2a8 = local_4e0;
  local_298 = pdStack_4d8;
  local_260 = local_4a8;
  local_250 = local_4e0;
  local_240 = pdStack_4d8;
  local_220 = local_488;
  local_1d8 = local_4a8;
  local_1c8 = local_4e0;
  local_1b8 = (complex<double> *)pdStack_4d8;
  local_190 = local_4a8;
  local_180 = local_4e0;
  local_170 = pdStack_4d8;
  local_150 = (complex<double> *)local_488;
  local_120 = local_4a8;
  local_110 = local_4e0;
  local_100 = (complex<double> *)pdStack_4d8;
  local_d8 = local_4a8;
  local_c8 = local_4e0;
  local_b8 = pdStack_4d8;
  local_4c8.m_cols =
       local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_4c8.m_data;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_398;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_4c8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)local_380;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)&local_440;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)&local_428;
  Eigen::internal::dense_assignment_loop<$520e73b0$>::run
            ((generic_dense_assignment_kernel<_66f29dd1_> *)&local_90);
  local_328.m_other = local_458.m_data[local_458.m_rows * 2 + 5];
  local_208 = (complex<double> *)local_458.m_data[local_458.m_rows * 2];
  local_2e8 = (complex<double> *)local_458.m_data[local_458.m_rows * 2 + 2];
  local_1f0 = local_458.m_data[local_458.m_rows * 2 + 3];
  dVar15 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_2d0 = (PointerType)(local_1f0 * dVar15);
  local_290 = (complex<double> *)local_458.m_data[local_458.m_rows * 2 + 7];
  local_278.m_value = (long)local_458.m_data[local_458.m_rows * 2 + 9];
  local_230 = local_490 + (long)local_488 * 2;
  local_1a8 = (PointerType)(dVar15 * local_328.m_other);
  local_160 = local_490 + (long)local_488;
  local_138 = (PointerType)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] * local_1f0);
  local_4c8.m_data =
       local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       2;
  local_f0 = (PointerType)
             ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2] * local_328.m_other);
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 9.88131291682493e-324;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  pdStack_358 = local_490;
  local_348 = local_488;
  local_310 = local_4a8;
  local_300 = local_4e0;
  local_2f0 = pdStack_4d8;
  local_2b8 = local_4a8;
  local_2a8 = local_4e0;
  local_298 = pdStack_4d8;
  local_260 = local_4a8;
  local_250 = local_4e0;
  local_240 = pdStack_4d8;
  local_220 = local_488;
  local_1d8 = local_4a8;
  local_1c8 = local_4e0;
  local_1b8 = (complex<double> *)pdStack_4d8;
  local_190 = local_4a8;
  local_180 = local_4e0;
  local_170 = pdStack_4d8;
  local_150 = (complex<double> *)local_488;
  local_120 = local_4a8;
  local_110 = local_4e0;
  local_100 = (complex<double> *)pdStack_4d8;
  local_d8 = local_4a8;
  local_c8 = local_4e0;
  local_b8 = pdStack_4d8;
  local_4c8.m_cols =
       local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_4c8.m_data;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_398;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_4c8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)local_380;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)&local_440;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)&local_428;
  Eigen::internal::dense_assignment_loop<$520e73b0$>::run
            ((generic_dense_assignment_kernel<_66f29dd1_> *)&local_90);
  local_328.m_other = local_458.m_data[local_458.m_rows * 3 + 5];
  local_208 = (complex<double> *)local_458.m_data[local_458.m_rows * 3];
  local_2e8 = (complex<double> *)local_458.m_data[local_458.m_rows * 3 + 2];
  local_1f0 = local_458.m_data[local_458.m_rows * 3 + 3];
  dVar15 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1];
  local_2d0 = (PointerType)(local_1f0 * dVar15);
  local_290 = (complex<double> *)local_458.m_data[local_458.m_rows * 3 + 7];
  local_278.m_value = (long)local_458.m_data[local_458.m_rows * 3 + 9];
  local_230 = local_490 + (long)local_488 * 2;
  local_1a8 = (PointerType)(dVar15 * local_328.m_other);
  local_160 = local_490 + (long)local_488;
  local_130 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0] * local_1f0;
  local_e8 = (complex<double> *)
             ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2] * local_328.m_other);
  local_4c8.m_data =
       local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       5;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 2.47032822920623e-323;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  pdStack_358 = local_490;
  local_348 = local_488;
  local_310 = local_4a8;
  local_300 = local_4e0;
  local_2f0 = pdStack_4d8;
  local_2b8 = local_4a8;
  local_2a8 = local_4e0;
  local_298 = pdStack_4d8;
  local_260 = local_4a8;
  local_250 = local_4e0;
  local_240 = pdStack_4d8;
  local_220 = local_488;
  local_1d8 = local_4a8;
  local_1c8 = local_4e0;
  local_1b8 = (complex<double> *)pdStack_4d8;
  local_190 = local_4a8;
  local_180 = local_4e0;
  local_170 = pdStack_4d8;
  local_150 = (complex<double> *)local_488;
  local_118 = local_4a8;
  local_108 = local_4e0;
  local_f8 = pdStack_4d8;
  local_d0 = local_4a8;
  local_c0 = local_4e0;
  local_b0 = pdStack_4d8;
  local_a8 = 0x3ff0000000000000;
  local_4c8.m_cols =
       local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_4c8.m_data;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_398;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_4c8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)local_380;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)&local_440;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)&local_428;
  Eigen::internal::dense_assignment_loop<$64b0bb91$>::run
            ((generic_dense_assignment_kernel<_aeebd7c4_> *)&local_90);
  local_380 = (undefined1  [8])0x7;
  local_378.m_value = 6;
  local_370 = (PointerType)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_440,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_380);
  local_370 = (PointerType)((long)local_4e0->_M_value + pdStack_4d8 * 8);
  local_340 = local_490 + (long)local_488;
  local_310 = (PointerType)local_458.m_data[3];
  local_230 = (PointerType)local_458.m_data[4];
  dVar15 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  local_2b8 = (PointerType)((double)local_230 * dVar15);
  local_2d0 = (PointerType)*local_458.m_data;
  local_248 = (complex<double> *)local_458.m_data[1];
  local_1e8 = (PointerType)(dVar15 * (double)local_310);
  local_1a0 = local_490 + (long)local_488 * 2;
  local_178 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0] * (double)local_310;
  local_130 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1] * (double)local_230;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_440;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = local_438;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = local_438;
  local_360 = pdStack_4d8;
  local_330 = local_488;
  local_2f8 = local_4a8;
  local_2e8 = local_4e0;
  local_2d8.m_other = (double)pdStack_4d8;
  local_2a0.m_value = (long)local_4a8;
  local_290 = local_4e0;
  local_280 = pdStack_4d8;
  local_270.m_other = (double)local_490;
  local_260 = local_488;
  local_218 = local_4a8;
  local_208 = local_4e0;
  local_1f8 = pdStack_4d8;
  local_1d0 = local_4a8;
  local_1c0 = local_4e0;
  local_1b0 = pdStack_4d8;
  local_190 = local_488;
  local_160 = local_4a8;
  local_150 = local_4e0;
  local_140 = pdStack_4d8;
  local_118 = local_4a8;
  local_108 = local_4e0;
  local_f8 = pdStack_4d8;
  local_4c8.m_data = (double *)local_440;
  local_4c8.m_cols = (Index)local_438;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_440;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_4c8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)local_380;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)&local_3b8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)&local_428;
  Eigen::internal::dense_assignment_loop<$a4ffa939$>::run
            ((generic_dense_assignment_kernel<_a44e1f68_> *)&local_90);
  local_370 = (PointerType)((long)local_4e0->_M_value + pdStack_4d8 * 8);
  local_340 = local_490 + (long)local_488;
  local_310 = (PointerType)local_458.m_data[local_458.m_rows + 3];
  local_230 = (PointerType)local_458.m_data[local_458.m_rows + 4];
  dVar15 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  local_2b8 = (PointerType)((double)local_230 * dVar15);
  local_2d0 = (PointerType)local_458.m_data[local_458.m_rows];
  local_248 = (complex<double> *)local_458.m_data[local_458.m_rows + 1];
  local_1e8 = (PointerType)(dVar15 * (double)local_310);
  local_1a0 = local_490 + (long)local_488 * 2;
  local_178 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0] * (double)local_310;
  local_4c8.m_data =
       (double *)
       (&(local_440->
         super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
         .m_data + (long)local_438);
  local_130 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1] * (double)local_230;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = local_438;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 4.94065645841247e-324;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = local_438;
  local_360 = pdStack_4d8;
  local_330 = local_488;
  local_2f8 = local_4a8;
  local_2e8 = local_4e0;
  local_2d8.m_other = (double)pdStack_4d8;
  local_2a0.m_value = (long)local_4a8;
  local_290 = local_4e0;
  local_280 = pdStack_4d8;
  local_270.m_other = (double)local_490;
  local_260 = local_488;
  local_218 = local_4a8;
  local_208 = local_4e0;
  local_1f8 = pdStack_4d8;
  local_1d0 = local_4a8;
  local_1c0 = local_4e0;
  local_1b0 = pdStack_4d8;
  local_190 = local_488;
  local_160 = local_4a8;
  local_150 = local_4e0;
  local_140 = pdStack_4d8;
  local_118 = local_4a8;
  local_108 = local_4e0;
  local_f8 = pdStack_4d8;
  local_4c8.m_cols = (Index)local_438;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_4c8.m_data;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_440;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_4c8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)local_380;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)&local_3b8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)&local_428;
  Eigen::internal::dense_assignment_loop<$a4ffa939$>::run
            ((generic_dense_assignment_kernel<_a44e1f68_> *)&local_90);
  local_370 = (PointerType)((long)local_4e0->_M_value + pdStack_4d8 * 8);
  local_340 = local_490 + (long)local_488;
  local_310 = (PointerType)local_458.m_data[local_458.m_rows * 2 + 3];
  local_230 = (PointerType)local_458.m_data[local_458.m_rows * 2 + 4];
  dVar15 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  local_2b8 = (PointerType)((double)local_230 * dVar15);
  local_2d0 = (PointerType)local_458.m_data[local_458.m_rows * 2];
  local_248 = (complex<double> *)local_458.m_data[local_458.m_rows * 2 + 1];
  local_1e8 = (PointerType)(dVar15 * (double)local_310);
  local_1a0 = local_490 + (long)local_488 * 2;
  local_178 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0] * (double)local_310;
  local_4c8.m_data =
       (double *)
       (&(local_440->
         super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>).
         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
         .m_data + (long)local_438 * 2);
  local_130 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1] * (double)local_230;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = local_438;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 9.88131291682493e-324;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = local_438;
  local_360 = pdStack_4d8;
  local_330 = local_488;
  local_2f8 = local_4a8;
  local_2e8 = local_4e0;
  local_2d8.m_other = (double)pdStack_4d8;
  local_2a0.m_value = (long)local_4a8;
  local_290 = local_4e0;
  local_280 = pdStack_4d8;
  local_270.m_other = (double)local_490;
  local_260 = local_488;
  local_218 = local_4a8;
  local_208 = local_4e0;
  local_1f8 = pdStack_4d8;
  local_1d0 = local_4a8;
  local_1c0 = local_4e0;
  local_1b0 = pdStack_4d8;
  local_190 = local_488;
  local_160 = local_4a8;
  local_150 = local_4e0;
  local_140 = pdStack_4d8;
  local_118 = local_4a8;
  local_108 = local_4e0;
  local_f8 = pdStack_4d8;
  local_4c8.m_cols = (Index)local_438;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_4c8.m_data;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_440;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_4c8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)local_380;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)&local_3b8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)&local_428;
  Eigen::internal::dense_assignment_loop<$a4ffa939$>::run
            ((generic_dense_assignment_kernel<_a44e1f68_> *)&local_90);
  local_370 = (PointerType)((long)local_4e0->_M_value + pdStack_4d8 * 8);
  local_340 = local_490 + (long)local_488;
  local_310 = (PointerType)local_458.m_data[local_458.m_rows * 3 + 3];
  local_230 = (PointerType)local_458.m_data[local_458.m_rows * 3 + 4];
  dVar15 = (pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2];
  local_2b8 = (PointerType)((double)local_230 * dVar15);
  local_2d0 = (PointerType)local_458.m_data[local_458.m_rows * 3];
  local_248 = (complex<double> *)local_458.m_data[local_458.m_rows * 3 + 1];
  local_1e8 = (PointerType)(dVar15 * (double)local_310);
  local_1a0 = local_490 + (long)local_488 * 2;
  local_170 = (PointerType)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] * (double)local_310);
  local_128 = (PointerType)
              ((pVVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[1] * (double)local_230);
  local_4c8.m_data = (double *)((long)local_440 + (long)local_438 * 0x28);
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = local_438;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 2.47032822920623e-323;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = local_438;
  local_360 = pdStack_4d8;
  local_330 = local_488;
  local_2f8 = local_4a8;
  local_2e8 = local_4e0;
  local_2d8.m_other = (double)pdStack_4d8;
  local_2a0.m_value = (long)local_4a8;
  local_290 = local_4e0;
  local_280 = pdStack_4d8;
  local_270.m_other = (double)local_490;
  local_260 = local_488;
  local_218 = local_4a8;
  local_208 = local_4e0;
  local_1f8 = pdStack_4d8;
  local_1d0 = local_4a8;
  local_1c0 = local_4e0;
  local_1b0 = pdStack_4d8;
  local_190 = local_488;
  local_158 = local_4a8;
  local_148 = local_4e0;
  local_138 = pdStack_4d8;
  local_110 = (complex<double> *)local_4a8;
  local_100 = local_4e0;
  local_f0 = pdStack_4d8;
  local_e8 = (complex<double> *)0x3ff0000000000000;
  local_4c8.m_cols = (Index)local_438;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_4c8.m_data;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_440;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)&local_4c8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)local_380;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)&local_3b8;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)&local_428;
  Eigen::internal::dense_assignment_loop<$61c3f364$>::run
            ((generic_dense_assignment_kernel<_e2bb5851_> *)&local_90);
  local_380 = (undefined1  [8])((long)local_4e0->_M_value + pdStack_4d8 * 8);
  local_378.m_value = (long)pdStack_4d8;
  local_368.m_value = (long)&local_4e0;
  local_360 = (PointerType)0x0;
  pdStack_358 = (double *)0x1;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)(local_440 + (long)local_438);
  local_350 = pdStack_4d8;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = local_438;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 1.48219693752374e-323;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = local_438;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_440;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::operator=
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
             &local_428,
             (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1> *)
             local_380);
  pdVar8 = (double *)((long)local_440 + (long)local_438 * 0x20);
  dVar15 = local_438;
  if ((((ulong)pdVar8 & 7) == 0) &&
     (dVar15 = (double)(ulong)((uint)((ulong)pdVar8 >> 3) & 1), (long)local_438 <= (long)dVar15)) {
    dVar15 = local_438;
  }
  lVar16 = (long)local_438 - (long)dVar15;
  if (0 < (long)dVar15) {
    dVar17 = 0.0;
    do {
      pdVar8[(long)dVar17] =
           ((double)local_4a8 - *(double *)((long)local_4e0->_M_value + dVar17 * 8)) *
           -*(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8);
      dVar17 = (double)((long)dVar17 + 1);
    } while (dVar15 != dVar17);
  }
  lVar13 = (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + (long)dVar15;
  dVar17 = dVar15;
  if (1 < lVar16) {
    do {
      dVar21 = ((double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8))[1];
      dVar2 = ((double *)((long)local_4e0->_M_value + dVar17 * 8))[1];
      pdVar8[(long)dVar17] =
           ((double)local_4a8 - *(double *)((long)local_4e0->_M_value + dVar17 * 8)) *
           -*(double *)((long)local_4e0->_M_value + ((long)pdStack_4d8 + (long)dVar17) * 8);
      (pdVar8 + (long)dVar17)[1] = ((double)local_4a8 - dVar2) * -dVar21;
      dVar17 = (double)((long)dVar17 + 2);
    } while ((long)dVar17 < lVar13);
  }
  if (lVar13 < (long)local_438) {
    lVar13 = lVar16 % 2;
    pdVar8 = (double *)((long)local_4e0[lVar16 / 2]._M_value + dVar15 * 8);
    pdVar11 = (double *)
              ((long)local_440 + (long)local_438 * 0x20 + (lVar16 / 2) * 0x10 + (long)dVar15 * 8);
    do {
      *pdVar11 = ((double)local_4a8 - *pdVar8) * -pdVar8[(long)pdStack_4d8];
      pdVar8 = pdVar8 + 1;
      pdVar11 = pdVar11 + 1;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  Eigen::GeneralizedEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::GeneralizedEigenSolver
            ((GeneralizedEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_380);
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)&local_398;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 2.96439387504748e-323;
  local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = (double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
  local_4c8.m_data = (double *)0x0;
  local_4c8.m_rows = 0;
  local_4c8.m_cols = 0;
  if (((double)local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols != 0.0) &&
     (auVar20 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar20 / SEXT816(local_398.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols),0) < 6)) {
    puVar9 = (undefined8 *)
             __cxa_allocate_exception
                       (8,local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0],
                        SUB168(auVar20 % SEXT816(local_398.
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                 .m_storage.m_cols),0));
    *puVar9 = std::ios::widen;
    __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_4c8,
             local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols * 6,6,
             local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_4c8,
             (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_428,
             (assign_op<double,_double> *)&local_90);
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)local_440;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = 6;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = (long)local_430;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startRow.
  m_value = 0;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startCol.
  m_value = 0;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_outerStride
       = (Index)local_438;
  local_3b8.m_data = (double *)0x0;
  local_3b8.m_rows = 0;
  local_3b8.m_cols = 0;
  local_90.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
       (XprTypeNested)&local_440;
  if ((local_430 != (assign_op<double,_double> *)0x0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)local_430),0) < 6))
  {
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = std::ios::widen;
    __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_3b8,(long)local_430 * 6,6,(Index)local_430);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_3b8,&local_90,&local_459);
  Eigen::GeneralizedEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::compute
            ((GeneralizedEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_380,
             (MatrixType *)&local_4c8,(MatrixType *)&local_3b8,true);
  free(local_3b8.m_data);
  free(local_4c8.m_data);
  local_4c8.m_data = (double *)0x0;
  local_4c8.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)&local_4c8,
             (Index)local_350,1);
  pdVar8 = pdStack_358;
  vVar5.m_value = local_368.m_value;
  pdVar14 = local_350;
  if ((PointerType)local_4c8.m_rows != local_350) {
    Eigen::PlainObjectBase<Eigen::Matrix<std::complex<double>,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)&local_4c8,
               (Index)local_350,1);
    pdVar14 = (PointerType)local_4c8.m_rows;
  }
  if (0 < (long)pdVar14) {
    lVar16 = 0;
    do {
      puVar1 = (ulong *)(vVar5.m_value + lVar16 * 2);
      auVar19._0_8_ = *puVar1 ^ 0x8000000000000000;
      auVar19._8_8_ = puVar1[1] ^ 0x8000000000000000;
      auVar20._8_8_ = *(undefined8 *)((long)pdVar8 + lVar16);
      auVar20._0_8_ = *(undefined8 *)((long)pdVar8 + lVar16);
      auVar20 = divpd(auVar19,auVar20);
      *(undefined1 (*) [16])((long)local_4c8.m_data + lVar16 * 2) = auVar20;
      lVar16 = lVar16 + 8;
      pdVar14 = (PointerType)((long)pdVar14 + -1);
    } while (pdVar14 != (PointerType)0x0);
  }
  Eigen::DenseStorage<std::complex<double>,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<std::complex<double>,__1,__1,__1,_0> *)&local_90,
             (DenseStorage<std::complex<double>,__1,__1,__1,_0> *)local_380);
  if (0 < local_4c8.m_rows) {
    lVar16 = 0;
    lVar13 = 0;
    pdVar14 = (PointerType)local_4c8.m_rows;
    do {
      vVar5.m_value =
           local_90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_rows.m_value;
      pdVar6 = local_90.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
               .m_data;
      local_4a8 = (PointerType)local_4c8.m_data[lVar13 * 2];
      uStack_4a0 = 0;
      if ((1e-05 < ABS((double)local_4a8)) && (ABS(local_4c8.m_data[lVar13 * 2 + 1]) < 1e-05)) {
        local_3b8.m_data = (double *)0x0;
        local_3b8.m_rows = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_3b8,
                   local_90.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                   .m_rows.m_value,1);
        vVar10.m_value = vVar5.m_value;
        if (local_3b8.m_rows != vVar5.m_value) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_3b8,
                     vVar5.m_value,1);
          vVar10.m_value = local_3b8.m_rows;
        }
        local_428.f = 1.0 / (double)local_4a8;
        if (0 < vVar10.m_value) {
          pvVar12 = (variable_if_dynamic<long,__1> *)
                    ((long)&(((block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                               *)pdVar6)->
                            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            ).m_data + vVar5.m_value * lVar16);
          lVar18 = 0;
          do {
            local_3b8.m_data[lVar18] = (double)pvVar12->m_value;
            lVar18 = lVar18 + 1;
            pvVar12 = pvVar12 + 2;
          } while (vVar10.m_value != lVar18);
        }
        local_428.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_3b8.m_data[5];
        dVar15 = *local_3b8.m_data /
                 local_428.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
        dVar21 = local_3b8.m_data[1] /
                 local_428.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
        dVar17 = local_3b8.m_data[2] /
                 local_428.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
        local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_3b8.m_data[3] /
                   local_428.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2];
        local_428.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_3b8.m_data[4] /
                   local_428.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2];
        local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = local_458.m_data[local_458.m_rows * 2 + 7] * dVar17 +
                   local_458.m_data[7] * dVar15 + local_458.m_data[local_458.m_rows + 7] * dVar21 +
                   local_458.m_data[local_458.m_rows * 3 + 7];
        local_428.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = local_458.m_data[local_458.m_rows * 2 + 9] * dVar17 +
                   local_458.m_data[9] * dVar15 + local_458.m_data[local_458.m_rows + 9] * dVar21 +
                   local_458.m_data[local_458.m_rows * 3 + 9];
        local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_458.m_data[local_458.m_rows * 2] * dVar17 +
                   *local_458.m_data * dVar15 + local_458.m_data[local_458.m_rows] * dVar21 +
                   local_458.m_data[local_458.m_rows * 3];
        local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = (local_458.m_data + local_458.m_rows * 2)[1] * dVar17 +
                   local_458.m_data[1] * dVar15 + (local_458.m_data + local_458.m_rows)[1] * dVar21
                   + (local_458.m_data + local_458.m_rows * 3)[1];
        local_428.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_458.m_data[local_458.m_rows * 3 + 2] +
                   local_458.m_data[local_458.m_rows * 2 + 2] * dVar17 +
                   local_458.m_data[2] * dVar15 + local_458.m_data[local_458.m_rows + 2] * dVar21;
        local_428.C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_458.m_data[local_458.m_rows * 3 + 6] +
                   local_458.m_data[local_458.m_rows * 2 + 6] * dVar17 +
                   local_458.m_data[6] * dVar15 + local_458.m_data[local_458.m_rows + 6] * dVar21;
        local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_458.m_data[local_458.m_rows * 2 + 3] * dVar17 +
                   local_458.m_data[3] * dVar15 + local_458.m_data[local_458.m_rows + 3] * dVar21 +
                   local_458.m_data[local_458.m_rows * 3 + 3];
        local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = (local_458.m_data + local_458.m_rows * 2 + 3)[1] * dVar17 +
                   local_458.m_data[4] * dVar15 +
                   (local_458.m_data + local_458.m_rows + 3)[1] * dVar21 +
                   (local_458.m_data + local_458.m_rows * 3 + 3)[1];
        local_428.w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_458.m_data[local_458.m_rows * 2 + 5] * dVar17 +
                   local_458.m_data[5] * dVar15 + local_458.m_data[local_458.m_rows + 5] * dVar21 +
                   local_458.m_data[local_458.m_rows * 3 + 5];
        local_428.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = local_458.m_data[local_458.m_rows * 2 + 8] * dVar17 +
                   local_458.m_data[8] * dVar15 + local_458.m_data[local_458.m_rows + 8] * dVar21 +
                   local_458.m_data[local_458.m_rows * 3 + 8];
        local_428.rd = 0.0;
        std::vector<RSDoublelinCameraPose,_std::allocator<RSDoublelinCameraPose>_>::
        emplace_back<RSDoublelinCameraPose>(local_38,&local_428);
        free(local_3b8.m_data);
        pdVar14 = (PointerType)local_4c8.m_rows;
      }
      lVar13 = lVar13 + 1;
      lVar16 = lVar16 + 0x10;
    } while (lVar13 < (long)pdVar14);
  }
  free(local_90.
       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
       m_data);
  free(local_4c8.m_data);
  free((void *)local_2a0.m_value);
  free((void *)local_2e0.m_value);
  free(local_2f8);
  free(local_310);
  free((void *)local_328.m_other);
  free(local_340);
  free(pdStack_358);
  free((void *)local_368.m_value);
  free((void *)local_380);
  free(local_440);
  free(local_398.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_458.m_data);
  free(local_58.m_data);
  free(local_478.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_4e0);
  free(local_490);
  return 0;
}

Assistant:

int R7PfIter(const Eigen::MatrixXd & Xin, const Eigen::MatrixXd & uin, const Eigen::Vector3d & vk, double r0, RSDoublelinCameraPoseVector * results){

Eigen::MatrixXd X =  Xin.transpose();
Eigen::MatrixXd u =  uin.transpose();

Eigen::MatrixXd A = Eigen::MatrixXd::Zero(7,11);

A.col(0) = -X.col(2).cwiseProduct(u.col(0));
A.col(1) = -X.col(2).cwiseProduct(u.col(1));
A.col(2) = X.col(0).cwiseProduct(u.col(0)) + X.col(1).cwiseProduct(u.col(1));
A.col(3) = u.col(0).array() * (X.col(2).array() * (r0 - u.col(0).array()) - X.col(0).array() * vk(1) * (r0 - u.col(0).array()) + X.col(1).array() * vk(0) * (r0 - u.col(0).array()));
A.col(4) = u.col(1).array() * (X.col(2).array() * (r0 - u.col(0).array()) - X.col(0).array() * vk(1) * (r0 - u.col(0).array()) + X.col(1).array() * vk(0) * (r0 - u.col(0).array()));
A.col(5) = -u.col(0).array() * (X.col(0).array() * (r0 - u.col(0).array()) - X.col(1).array() * vk(2) * (r0 - u.col(0).array()) + X.col(2).array() * vk(1) * (r0 - u.col(0).array())) - u.col(1).array() * (X.col(1).array() * (r0 - u.col(0).array()) + X.col(0).array() * vk(2) * (r0 - u.col(0).array())- X.col(2).array() * vk(0) * (r0 - u.col(0).array()));
A.col(6) = -u.col(1);
A.col(7) = u.col(0);
A.col(8) = u.col(1).array() * (r0 - u.col(0).array());
A.col(9) = -u.col(0).array() * (r0 - u.col(0).array());
A.col(10) = X.col(1).cwiseProduct(u.col(0)) - X.col(0).cwiseProduct(u.col(1));


Eigen::MatrixXd nn = A.fullPivLu().kernel();

Eigen::MatrixXd n(10,4);




for ( int i = 0; i < 10; i++)
{
    n(i,0) = nn(i,0) - (nn(i,3) * nn(10,0)/nn(10,3));
    n(i,1) = nn(i,1) - (nn(i,3) * nn(10,1)/nn(10,3));
    n(i,2) = nn(i,2) - (nn(i,3) * nn(10,2)/nn(10,3));
    n(i,3) = nn(i,3)/nn(10,3);
}


Eigen::MatrixXd A0 = Eigen::MatrixXd::Zero(7,6);

A0.col(0) = X.col(0).array() * (n(5,0) * (r0 - u.col(0).array()) - n(2,0) + n(3,0) * vk(1) * (r0 - u.col(0).array())) - n(7,0) + n(9,0) * (r0 - u.col(0).array()) + X.col(2).array() * (n(0,0) - n(3,0) * (r0 - u.col(0).array()) + n(5,0) * vk(1) * (r0 - u.col(0).array())) - X.col(1).array() * (n(3,0) * vk(0) * (r0 - u.col(0).array()) + n(5,0) * vk(2) * (r0 - u.col(0).array()));
A0.col(1) = X.col(0).array() * (n(5,1) * (r0 - u.col(0).array()) - n(2,1) + n(3,1) * vk(1) * (r0 - u.col(0).array())) - n(7,1) + n(9,1) * (r0 - u.col(0).array()) + X.col(2).array() * (n(0,1) - n(3,1) * (r0 - u.col(0).array()) + n(5,1) * vk(1) * (r0 - u.col(0).array())) - X.col(1).array() * (n(3,1) * vk(0) * (r0 - u.col(0).array()) + n(5,1) * vk(2) * (r0 - u.col(0).array()));
A0.col(2) = X.col(0).array() * (n(5,2) * (r0 - u.col(0).array()) - n(2,2) + n(3,2) * vk(1) * (r0 - u.col(0).array())) - n(7,2) + n(9,2) * (r0 - u.col(0).array()) + X.col(2).array() * (n(0,2) - n(3,2) * (r0 - u.col(0).array()) + n(5,2) * vk(1) * (r0 - u.col(0).array())) - X.col(1).array() * (n(3,2) * vk(0) * (r0 - u.col(0).array()) + n(5,2) * vk(2) * (r0 - u.col(0).array()));
A0.col(5) = X.col(0).array() * (n(5,3) * (r0 - u.col(0).array()) - n(2,3) + n(3,3) * vk(1) * (r0 - u.col(0).array())) - n(7,3) + n(9,3) * (r0 - u.col(0).array()) + X.col(2).array() * (n(0,3) - n(3,3) * (r0 - u.col(0).array()) + n(5,3) * vk(1) * (r0 - u.col(0).array())) - X.col(1).array() * (n(3,3) * vk(0) * (r0 - u.col(0).array()) + n(5,3) * vk(2) * (r0 - u.col(0).array())+1);

Eigen::MatrixXd A1 = Eigen::MatrixXd::Zero(7,6);

A1.col(0) = -u.col(1).array() * (X.col(1).array() * (n(3,0) * (r0 - u.col(0).array()) - n(0,0) + n(4,0) * vk(2) * (r0 - u.col(0).array())) + X.col(0).array() * (n(1,0) - n(4,0) * (r0 - u.col(0).array()) + n(3,0) * vk(2) * (r0-u.col(0).array())) - X.col(2).array() * (n(3,0) * vk(0) * (r0 - u.col(0).array()) + n(4,0) * vk(1) * (r0 - u.col(0).array())));
A1.col(1) = -u.col(1).array() * (X.col(1).array() * (n(3,1) * (r0 - u.col(0).array()) - n(0,1) + n(4,1) * vk(2) * (r0 - u.col(0).array())) + X.col(0).array() * (n(1,1) - n(4,1) * (r0 - u.col(0).array()) + n(3,1) * vk(2) * (r0-u.col(0).array())) - X.col(2).array() * (n(3,1) * vk(0) * (r0 - u.col(0).array()) + n(4,1) * vk(1) * (r0 - u.col(0).array())));
A1.col(2) = -u.col(1).array() * (X.col(1).array() * (n(3,2) * (r0 - u.col(0).array()) - n(0,2) + n(4,2) * vk(2) * (r0 - u.col(0).array())) + X.col(0).array() * (n(1,2) - n(4,2) * (r0 - u.col(0).array()) + n(3,2) * vk(2) * (r0-u.col(0).array())) - X.col(2).array() * (n(3,2) * vk(0) * (r0 - u.col(0).array()) + n(4,2) * vk(1) * (r0 - u.col(0).array())));
A1.col(5) = -u.col(1).array() * (X.col(1).array() * (n(3,3) * (r0 - u.col(0).array()) - n(0,3) + n(4,3) * vk(2) * (r0 - u.col(0).array())) + X.col(0).array() * (n(1,3) - n(4,3) * (r0 - u.col(0).array()) + n(3,3) * vk(2) * (r0-u.col(0).array())) - X.col(2).array() * (n(3,3) * vk(0) * (r0 - u.col(0).array()) + n(4,3) * vk(1) * (r0 - u.col(0).array())+1));
A1.col(3) = u.col(1);
A1.col(4) = -u.col(1).array() * (r0 - u.col(0).array());



Eigen::GeneralizedEigenSolver<Eigen::MatrixXd> ges;
ges.compute(A0.topRows(6), A1.topRows(6),true);
Eigen::VectorXcd ff = -ges.eigenvalues();
Eigen::MatrixXcd xx = ges.eigenvectors();

for (int i = 0; i < ff.rows(); i++)
{
    if(std::abs(ff(i).real()) > 10e-6 & std::abs(ff(i).imag()) < 10e-6){
        double f = 1/ff(i).real();
        double a, b, c;
        Eigen::Vector3d C,v,w,t;
        Eigen::VectorXd x = xx.col(i).real();
        a = x(0)/x(5);
        b = x(1)/x(5);
        c = x(2)/x(5);
        C(2) = x(3)/x(5);
        t(2) = x(4)/x(5);

        v(0) = a*n(0,0)+b*n(0,1)+c*n(0,2)+n(0,3);
        v(1) = a*n(1,0)+b*n(1,1)+c*n(1,2)+n(1,3);
        v(2) = a*n(2,0)+b*n(2,1)+c*n(2,2)+n(2,3);
        w(0) = a*n(3,0)+b*n(3,1)+c*n(3,2)+n(3,3);
        w(1) = a*n(4,0)+b*n(4,1)+c*n(4,2)+n(4,3);
        w(2) = a*n(5,0)+b*n(5,1)+c*n(5,2)+n(5,3);
        C(0) = a*n(6,0)+b*n(6,1)+c*n(6,2)+n(6,3);
        C(1) = a*n(7,0)+b*n(7,1)+c*n(7,2)+n(7,3);
        t(0) = a*n(8,0)+b*n(8,1)+c*n(8,2)+n(8,3);
        t(1) = a*n(9,0)+b*n(9,1)+c*n(9,2)+n(9,3);
      
        results->push_back({v, C, w, t, f, 0});
    }
}

return 0;

}